

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::TransformFeedback::CaptureVertexInterleaved::iterate(CaptureVertexInterleaved *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  ContextInfo *this_00;
  undefined4 extraout_var_00;
  undefined4 *puVar3;
  TestContext *this_01;
  TestLog *this_02;
  MessageBuilder *this_03;
  byte local_1f1;
  byte local_1ef;
  byte local_1ee;
  byte local_1ed;
  MessageBuilder local_1c0;
  uint local_3c;
  uint local_38;
  GLuint i_primitive_case;
  GLint i_bind_case;
  byte local_27;
  byte local_26;
  byte local_25;
  deUint32 local_24;
  bool test_error;
  bool is_ok;
  ApiType AStack_20;
  bool is_ext_tf_1;
  byte local_19;
  long lStack_18;
  bool is_at_least_gl_30;
  Functions *gl;
  CaptureVertexInterleaved *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  AStack_20.m_bits = (*pRVar2->_vptr_RenderContext[2])();
  local_24 = (deUint32)glu::ApiType::core(3,0);
  local_19 = glu::contextSupports((ContextType)AStack_20.m_bits,(ApiType)local_24);
  this_00 = deqp::Context::getContextInfo(this->m_context);
  local_25 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_transform_feedback");
  local_26 = 1;
  local_27 = 0;
  if ((bool)local_25) {
    pRVar2 = deqp::Context::getRenderContext(this->m_context);
    iVar1 = (*pRVar2->_vptr_RenderContext[7])(pRVar2,"glBindBufferOffsetEXT");
    this->m_glBindBufferOffsetEXT = (BindBufferOffsetEXT_ProcAddress)CONCAT44(extraout_var_00,iVar1)
    ;
    if (this->m_glBindBufferOffsetEXT == (BindBufferOffsetEXT_ProcAddress)0x0) {
      puVar3 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar3 = 0;
      __cxa_throw(puVar3,&int::typeinfo,0);
    }
  }
  if (((local_19 & 1) != 0) || ((local_25 & 1) != 0)) {
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])();
    createFramebuffer(this);
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])();
    createVertexArrayObject(this);
    (**(code **)(lStack_18 + 0x1680))(this->m_program);
    err = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(err,"glUseProgram call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x94c);
    local_38 = 0;
    while( true ) {
      local_1ed = 0;
      if ((int)local_38 < 3) {
        local_1ed = local_26;
      }
      if ((local_1ed & 1) == 0) break;
      if ((local_38 != 2) || (this->m_glBindBufferOffsetEXT != (BindBufferOffsetEXT_ProcAddress)0x0)
         ) {
        (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
                  (this,(ulong)local_38);
        local_3c = 0;
        while( true ) {
          local_1ee = 0;
          if (local_3c < 7) {
            local_1ee = local_26;
          }
          if ((local_1ee & 1) == 0) break;
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
                    (this,(ulong)local_3c);
          local_1ef = 0;
          if ((local_26 & 1) != 0) {
            iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])
                              (this,(ulong)s_primitive_cases[local_3c]);
            local_1ef = (byte)iVar1;
          }
          local_26 = local_1ef & 1;
          local_1f1 = 0;
          if (local_26 != 0) {
            iVar1 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                              (this,(ulong)local_38,(ulong)s_primitive_cases[local_3c]);
            local_1f1 = (byte)iVar1;
          }
          local_26 = local_1f1 & 1;
          local_3c = local_3c + 1;
        }
      }
      local_38 = local_38 + 1;
    }
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0xc])();
  if ((local_26 & 1) == 0) {
    if ((local_27 & 1) == 0) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_INTERNAL_ERROR,"Error");
    }
  }
  else {
    this_01 = deqp::Context::getTestContext(this->m_context);
    this_02 = tcu::TestContext::getLog(this_01);
    tcu::TestLog::operator<<(&local_1c0,this_02,(BeginMessageToken *)&tcu::TestLog::Message);
    this_03 = tcu::MessageBuilder::operator<<
                        (&local_1c0,(char (*) [28])"Capture Vertex have passed.");
    tcu::MessageBuilder::operator<<(this_03,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::CaptureVertexInterleaved::iterate(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initializations. */
	bool is_at_least_gl_30 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 0)));
	bool is_ext_tf_1	   = m_context.getContextInfo().isExtensionSupported("GL_EXT_transform_feedback");

	bool is_ok		= true;
	bool test_error = false;

	try
	{
		if (is_ext_tf_1)
		{
			/* Extension query. */
			m_glBindBufferOffsetEXT =
				(BindBufferOffsetEXT_ProcAddress)m_context.getRenderContext().getProcAddress("glBindBufferOffsetEXT");

			if (DE_NULL == m_glBindBufferOffsetEXT)
			{
				throw 0;
			}
		}

		if (is_at_least_gl_30 || is_ext_tf_1)
		{
			fetchLimits();
			buildProgram();
			createFramebuffer();
			createTransformFeedbackBuffer();
			createVertexArrayObject();

			gl.useProgram(m_program);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

			for (glw::GLint i_bind_case = 0; (i_bind_case < BIND_BUFFER_CASES_COUNT) && is_ok; ++i_bind_case)
			{
				if ((i_bind_case == BIND_BUFFER_OFFSET_CASE) && (DE_NULL == m_glBindBufferOffsetEXT))
				{
					continue;
				}

				bindBuffer((BindBufferCase)i_bind_case);

				for (glw::GLuint i_primitive_case = 0; (i_primitive_case < s_primitive_cases_count) && is_ok;
					 ++i_primitive_case)
				{
					draw(i_primitive_case);

					is_ok = is_ok && checkFramebuffer(s_primitive_cases[i_primitive_case]);
					is_ok = is_ok && checkTransformFeedbackBuffer((BindBufferCase)i_bind_case,
																  s_primitive_cases[i_primitive_case]);
				}
			}
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Clean objects. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Capture Vertex have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}